

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

MemoryRegionSection * phys_page_find(AddressSpaceDispatch *d,hwaddr addr)

{
  MemoryRegionSection *pMVar1;
  MemoryRegionSection *pMVar2;
  PhysPageEntry PVar3;
  MemoryRegionSection *pMVar5;
  int iVar6;
  uint uVar7;
  ulong uVar4;
  
  pMVar2 = (d->map).sections;
  PVar3 = d->phys_map;
  uVar7 = (uint)PVar3 & 0x3f;
  if (uVar7 != 0) {
    iVar6 = 6;
    do {
      iVar6 = iVar6 - uVar7;
      if (iVar6 < 0) break;
      if ((uint)PVar3 >> 6 == 0x3ffffff) {
        return pMVar2;
      }
      PVar3 = (d->map).nodes[(uint)PVar3 >> 6]
              [(uint)((addr >> 0xe) >> ((char)iVar6 * '\t' & 0x3fU)) & 0x1ff];
      uVar7 = (uint)PVar3 & 0x3f;
    } while (uVar7 != 0);
  }
  uVar4 = (ulong)((uint)PVar3 & 0xffffffc0);
  pMVar1 = (MemoryRegionSection *)((long)&pMVar2->size + uVar4);
  if (*(long *)((long)&pMVar2->size + uVar4 + 8) == 0) {
    pMVar5 = pMVar1;
    if ((*(long *)((long)&pMVar2->size + uVar4) + pMVar1->offset_within_address_space) - 1 < addr) {
      pMVar5 = pMVar2;
    }
    if (pMVar1->offset_within_address_space <= addr) {
      pMVar2 = pMVar5;
    }
    return pMVar2;
  }
  return pMVar1;
}

Assistant:

static MemoryRegionSection *phys_page_find(AddressSpaceDispatch *d, hwaddr addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    PhysPageEntry lp = d->phys_map, *p;
    Node *nodes = d->map.nodes;
    MemoryRegionSection *sections = d->map.sections;
    hwaddr index = addr >> TARGET_PAGE_BITS;
    int i;

    for (i = P_L2_LEVELS; lp.skip && (i -= lp.skip) >= 0;) {
        if (lp.ptr == PHYS_MAP_NODE_NIL) {
            return &sections[PHYS_SECTION_UNASSIGNED];
        }
        p = nodes[lp.ptr];
        lp = p[(index >> (i * P_L2_BITS)) & (P_L2_SIZE - 1)];
    }

    if (section_covers_addr(&sections[lp.ptr], addr)) {
        return &sections[lp.ptr];
    } else {
        return &sections[PHYS_SECTION_UNASSIGNED];
    }
}